

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::SamplerHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,SamplerHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  DebugMLTSampler *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  this_00 = (DebugMLTSampler *)(uVar1 & 0xffffffffffff);
  if (this_00 == (DebugMLTSampler *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x30);
    if (uVar1 >> 0x30 < 5) {
      if (uVar2 < 3) {
        if (uVar2 == 2) {
          StratifiedSampler::ToString_abi_cxx11_
                    (__return_storage_ptr__,(StratifiedSampler *)this_00);
        }
        else {
          RandomSampler::ToString_abi_cxx11_(__return_storage_ptr__,(RandomSampler *)this_00);
        }
      }
      else if (uVar2 == 3) {
        HaltonSampler::ToString_abi_cxx11_(__return_storage_ptr__,(HaltonSampler *)this_00);
      }
      else {
        PaddedSobolSampler::ToString_abi_cxx11_
                  (__return_storage_ptr__,(PaddedSobolSampler *)this_00);
      }
    }
    else if (uVar2 < 7) {
      if (uVar2 == 6) {
        ZSobolSampler::ToString_abi_cxx11_(__return_storage_ptr__,(ZSobolSampler *)this_00);
      }
      else {
        SobolSampler::ToString_abi_cxx11_(__return_storage_ptr__,(SobolSampler *)this_00);
      }
    }
    else if (uVar1 >> 0x30 == 8) {
      MLTSampler::ToString_abi_cxx11_(__return_storage_ptr__,(MLTSampler *)this_00);
    }
    else if (uVar2 == 7) {
      PMJ02BNSampler::ToString_abi_cxx11_(__return_storage_ptr__,(PMJ02BNSampler *)this_00);
    }
    else {
      DebugMLTSampler::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SamplerHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}